

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

void SynchFaceOrientation(ON_Brep *brep,int fi)

{
  ON_BrepFace *pOVar1;
  ON_BrepLoop *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepTrim *pOVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  pOVar1 = ON_Brep::Face(brep,fi);
  if ((pOVar1 != (ON_BrepFace *)0x0) && (0 < (pOVar1->m_li).m_count)) {
    uVar8 = 0xffffffff;
    lVar7 = 0;
    do {
      pOVar2 = ON_Brep::Loop(brep,(pOVar1->m_li).m_a[lVar7]);
      if (pOVar2 == (ON_BrepLoop *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        if (0 < (pOVar2->m_ti).m_count) {
          lVar9 = 0;
          do {
            pOVar3 = ON_Brep::Trim(brep,(pOVar2->m_ti).m_a[lVar9]);
            uVar6 = 7;
            if (((pOVar3 != (ON_BrepTrim *)0x0) &&
                (pOVar4 = ON_Brep::Edge(brep,pOVar3->m_ei), pOVar4 != (ON_BrepEdge *)0x0)) &&
               ((pOVar4->m_ti).m_count == 2)) {
              pOVar3 = ON_Brep::Trim(brep,*(pOVar4->m_ti).m_a);
              pOVar5 = ON_Brep::Trim(brep,(pOVar4->m_ti).m_a[1]);
              if (pOVar5 != (ON_BrepTrim *)0x0 && pOVar3 != (ON_BrepTrim *)0x0) {
                if (pOVar3->m_bRev3d == pOVar5->m_bRev3d) {
                  uVar6 = 1;
                  if ((uVar8 == 0xffffffff) || (uVar8 == 1)) {
LAB_00412fa1:
                    uVar8 = uVar6;
                    uVar6 = 0;
                  }
                }
                else {
                  uVar6 = 0;
                  if (uVar8 + 1 < 2) goto LAB_00412fa1;
                  uVar6 = 1;
                }
              }
            }
            if ((uVar6 != 7) && (uVar6 != 0)) goto LAB_00412ff5;
            lVar9 = lVar9 + 1;
          } while (lVar9 < (pOVar2->m_ti).m_count);
          uVar6 = 0;
        }
      }
LAB_00412ff5:
      if ((uVar6 & 3) != 0) {
        return;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pOVar1->m_li).m_count);
    if (uVar8 == 1) {
      ON_Brep::FlipFace(brep,(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a + fi);
      return;
    }
  }
  return;
}

Assistant:

static
void SynchFaceOrientation( ON_Brep& brep, int fi )
{
  const ON_BrepFace* face = brep.Face(fi);
  if ( face )
  {
    int flip = -1, fli, lti;
    for ( fli = 0; fli < face->m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = brep.Loop( face->m_li[fli] );
      if ( !loop )
        continue;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = brep.Trim( loop->m_ti[lti] );
        if ( !trim )
          continue;
        const ON_BrepEdge* edge = brep.Edge( trim->m_ei );
        if ( !edge )
          continue;
        if ( edge->m_ti.Count() != 2 )
          continue;
        const ON_BrepTrim* trim0 = brep.Trim( edge->m_ti[0] );
        const ON_BrepTrim* trim1 = brep.Trim( edge->m_ti[1] );
        if ( !trim0 || !trim1 )
          continue;
        bool bRev0 = trim0->m_bRev3d ? true : false;
        bool bRev1 = trim1->m_bRev3d ? true : false;
        if ( bRev0 == bRev1 )
        {
          if ( flip == -1 )
            flip = 1;
          else if (flip != 1 )
            return;
        }
        else
        {
          if ( flip == -1 )
            flip = 0;
          else if (flip != 0 )
            return;
        }
      }
    }
    if ( flip == 1 )
      brep.FlipFace(brep.m_F[fi]);
  }
}